

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

VkResult vkb::detail::get_vector<VkLayerProperties,VkResult(*&)(unsigned_int*,VkLayerProperties*)>
                   (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *out,
                   _func_VkResult_uint_ptr_VkLayerProperties_ptr **f)

{
  uint in_EAX;
  VkResult VVar1;
  uint32_t count;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  do {
    VVar1 = (**f)((uint *)((long)&uStack_28 + 4),(VkLayerProperties *)0x0);
    if (VVar1 != VK_SUCCESS) {
      return VVar1;
    }
    std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::resize
              (out,uStack_28 >> 0x20);
    VVar1 = (**f)((uint *)((long)&uStack_28 + 4),
                  (out->super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
                  _M_impl.super__Vector_impl_data._M_start);
    std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::resize
              (out,uStack_28 >> 0x20);
  } while (VVar1 == VK_INCOMPLETE);
  return VVar1;
}

Assistant:

auto get_vector(std::vector<T>& out, F&& f, Ts&&... ts) -> VkResult {
    uint32_t count = 0;
    VkResult err;
    do {
        err = f(ts..., &count, nullptr);
        if (err != VK_SUCCESS) {
            return err;
        };
        out.resize(count);
        err = f(ts..., &count, out.data());
        out.resize(count);
    } while (err == VK_INCOMPLETE);
    return err;
}